

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O0

bool __thiscall AgenPeeps::DependentOpnds(AgenPeeps *this,Opnd *opnd1,Opnd *opnd2)

{
  int iVar1;
  bool bVar2;
  RegNum RVar3;
  StackSym *pSVar4;
  RegOpnd *pRVar5;
  IndirOpnd *pIVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  SymOpnd *pSVar9;
  SymOpnd *local_70;
  SymOpnd *local_68;
  RegOpnd *index;
  RegOpnd *base;
  RegOpnd *regOpnd;
  SymOpnd *symOpnd2;
  SymOpnd *symOpnd1;
  RegNum baseReg;
  Opnd *opnd2_local;
  Opnd *opnd1_local;
  AgenPeeps *this_local;
  
  if ((opnd1 == (Opnd *)0x0) || (opnd2 == (Opnd *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = IsMemoryOpnd(this,opnd1);
    if ((bVar2) && (bVar2 = IsMemoryOpnd(this,opnd2), bVar2)) {
      bVar2 = IR::Opnd::IsSymOpnd(opnd1);
      if (bVar2) {
        local_68 = IR::Opnd::AsSymOpnd(opnd1);
      }
      else {
        local_68 = (SymOpnd *)0x0;
      }
      bVar2 = IR::Opnd::IsSymOpnd(opnd2);
      if (bVar2) {
        local_70 = IR::Opnd::AsSymOpnd(opnd2);
      }
      else {
        local_70 = (SymOpnd *)0x0;
      }
      if ((local_68 != (SymOpnd *)0x0) || (local_70 != (SymOpnd *)0x0)) {
        bVar2 = IR::Opnd::IsMemRefOpnd(opnd1);
        if ((bVar2) ||
           (((bVar2 = IR::Opnd::IsMemRefOpnd(opnd2), bVar2 ||
             (bVar2 = IR::Opnd::IsIndirOpnd(opnd1), bVar2)) ||
            (bVar2 = IR::Opnd::IsIndirOpnd(opnd2), bVar2)))) {
          return false;
        }
        if (((local_68 != (SymOpnd *)0x0) && (local_70 != (SymOpnd *)0x0)) &&
           ((bVar2 = Sym::IsStackSym(local_68->m_sym), bVar2 &&
            (bVar2 = Sym::IsStackSym(local_70->m_sym), bVar2)))) {
          pSVar4 = Sym::AsStackSym(local_68->m_sym);
          iVar1 = pSVar4->m_offset;
          pSVar4 = Sym::AsStackSym(local_70->m_sym);
          return iVar1 == pSVar4->m_offset;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      bVar2 = IR::Opnd::IsRegOpnd(opnd1);
      if (bVar2) {
        pRVar5 = IR::Opnd::AsRegOpnd(opnd1);
        bVar2 = IR::Opnd::IsRegOpnd(opnd2);
        if (bVar2) {
          pRVar7 = IR::Opnd::AsRegOpnd(opnd2);
          bVar2 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar7->super_Opnd);
          if (bVar2) {
            return true;
          }
        }
        bVar2 = IR::Opnd::IsIndirOpnd(opnd2);
        if (bVar2) {
          pIVar6 = IR::Opnd::AsIndirOpnd(opnd2);
          pRVar7 = IR::IndirOpnd::GetBaseOpnd(pIVar6);
          pIVar6 = IR::Opnd::AsIndirOpnd(opnd2);
          pRVar8 = IR::IndirOpnd::GetIndexOpnd(pIVar6);
          if (((pRVar7 != (RegOpnd *)0x0) &&
              (bVar2 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar7->super_Opnd), bVar2)) ||
             ((pRVar8 != (RegOpnd *)0x0 &&
              (bVar2 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar8->super_Opnd), bVar2)))) {
            return true;
          }
        }
        bVar2 = IR::Opnd::IsSymOpnd(opnd2);
        if (bVar2) {
          pSVar9 = IR::Opnd::AsSymOpnd(opnd2);
          bVar2 = Sym::IsStackSym(pSVar9->m_sym);
          if ((bVar2) && (RVar3 = IR::RegOpnd::GetReg(pRVar5), RVar3 == RegRBP)) {
            return true;
          }
        }
      }
      bVar2 = IR::Opnd::IsRegOpnd(opnd2);
      if (bVar2) {
        pRVar5 = IR::Opnd::AsRegOpnd(opnd2);
        bVar2 = IR::Opnd::IsIndirOpnd(opnd1);
        if (bVar2) {
          pIVar6 = IR::Opnd::AsIndirOpnd(opnd1);
          pRVar7 = IR::IndirOpnd::GetBaseOpnd(pIVar6);
          pIVar6 = IR::Opnd::AsIndirOpnd(opnd1);
          pRVar8 = IR::IndirOpnd::GetIndexOpnd(pIVar6);
          if (((pRVar7 != (RegOpnd *)0x0) &&
              (bVar2 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar7->super_Opnd), bVar2)) ||
             ((pRVar8 != (RegOpnd *)0x0 &&
              (bVar2 = IR::RegOpnd::IsSameRegUntyped(pRVar5,&pRVar8->super_Opnd), bVar2)))) {
            return true;
          }
        }
        bVar2 = IR::Opnd::IsSymOpnd(opnd1);
        if (bVar2) {
          pSVar9 = IR::Opnd::AsSymOpnd(opnd1);
          bVar2 = Sym::IsStackSym(pSVar9->m_sym);
          if ((bVar2) && (RVar3 = IR::RegOpnd::GetReg(pRVar5), RVar3 == RegRBP)) {
            return true;
          }
        }
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AgenPeeps::DependentOpnds(IR::Opnd *opnd1, IR::Opnd *opnd2)
{
#if defined (_M_IX86)
    const RegNum baseReg = RegEBP;
#elif defined (_M_X64)
    const RegNum baseReg = RegRBP;
#else
    AssertMsg(false, "Optimization not supported for ARM");
#endif

    if (!opnd1 || !opnd2)
        return false;

    // Memory dependence
    if (IsMemoryOpnd(opnd1) && IsMemoryOpnd(opnd2))
    {
        IR::SymOpnd *symOpnd1 = opnd1->IsSymOpnd() ? opnd1->AsSymOpnd() : nullptr;
        IR::SymOpnd *symOpnd2 = opnd2->IsSymOpnd() ? opnd2->AsSymOpnd() : nullptr;

        if (symOpnd1 || symOpnd2)
        {
            // SymOpnd do not alias with  MemRefOpnd/IndirOpnd
            if (opnd1->IsMemRefOpnd() || opnd2->IsMemRefOpnd() || opnd1->IsIndirOpnd() || opnd2->IsIndirOpnd())
                return false;

            // Two symOpnds are dependent if they point to the same stack symbol
            if (symOpnd1 && symOpnd2 &&
                symOpnd1->m_sym->IsStackSym() && symOpnd2->m_sym->IsStackSym() )
            {
                return symOpnd1->m_sym->AsStackSym()->m_offset == symOpnd2->m_sym->AsStackSym()->m_offset;
            }
        }
        // all other memory operands are dependent
        return true;
    }

    IR::RegOpnd *regOpnd, *base, *index;

    // Register dependences
    if (opnd1->IsRegOpnd())
    {
        regOpnd = opnd1->AsRegOpnd();
        // reg-to-reg
        if (opnd2->IsRegOpnd() && regOpnd->IsSameRegUntyped(opnd2->AsRegOpnd()))
            return true;

        // opnd2 = [base + indx + offset] and (opnd1 = base or opnd1 = indx)
        if (opnd2->IsIndirOpnd())
        {
            base = opnd2->AsIndirOpnd()->GetBaseOpnd();
            index = opnd2->AsIndirOpnd()->GetIndexOpnd();
            if ( (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index)) )
                return true;
        }
        // opnd1 = ebp/rbp and opnd2 = [ebp/rbp + offset]
        if (opnd2->IsSymOpnd() && opnd2->AsSymOpnd()->m_sym->IsStackSym() && regOpnd->GetReg() == baseReg)
            return true;
    }

    if (opnd2->IsRegOpnd())
    {
        regOpnd = opnd2->AsRegOpnd();

        // opnd1 = [base + indx + offset] and (opnd2 = base or opnd2 = indx)
        if (opnd1->IsIndirOpnd())
        {
            base = opnd1->AsIndirOpnd()->GetBaseOpnd();
            index = opnd1->AsIndirOpnd()->GetIndexOpnd();
            if ( (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index)) )
                return true;
        }

        // opnd2 = ebp/rbp and opnd1 = [ebp/rbp + offset]
        if (opnd1->IsSymOpnd() && opnd1->AsSymOpnd()->m_sym->IsStackSym() && regOpnd->GetReg() == baseReg)
            return true;
    }
    return false;
}